

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdstddht.cc
# Opt level: O2

void bdStdPrintNodeId(ostream *out,bdNodeId *a)

{
  string s;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  bdStdPrintNodeId(&s,a,true);
  std::operator<<(out,(string *)&s);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void bdStdPrintNodeId(std::ostream &out, const bdNodeId *a) {
	std::string s;
	bdStdPrintNodeId(s, a, true);
	out << s;
}